

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O2

int decoder_get_uint32_value(ndn_decoder_t *decoder,uint32_t *value)

{
  uint8_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  int i;
  int iVar4;
  
  if (decoder->input_size < decoder->offset + 4) {
    return -10;
  }
  *value = 0;
  puVar1 = decoder->input_value;
  uVar3 = 0;
  iVar4 = 0;
  for (iVar2 = 0x18; iVar2 != -8; iVar2 = iVar2 + -8) {
    uVar3 = uVar3 + ((uint)puVar1[decoder->offset + iVar4] << ((byte)iVar2 & 0x1f));
    *value = uVar3;
    iVar4 = iVar4 + 1;
  }
  decoder->offset = decoder->offset + 4;
  return 0;
}

Assistant:

static inline int
decoder_get_uint32_value(ndn_decoder_t* decoder, uint32_t* value)
{
  if (decoder->offset + 4 > decoder->input_size)
    return NDN_OVERSIZE;
  *value = 0;
  for (int i = 0; i < 4; i++) {
    *value += (uint32_t)decoder->input_value[decoder->offset + i] << (8 * (3 - i));
  }
  decoder->offset += 4;
  return 0;
}